

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utp_stream.cpp
# Opt level: O2

void __thiscall libtorrent::utp_stream::issue_write(utp_stream *this)

{
  utp_socket_impl *this_00;
  bool bVar1;
  
  this_00 = this->m_impl;
  this_00->m_write_handler = true;
  this_00->m_written = 0;
  bVar1 = utp_socket_impl::test_socket_state(this_00);
  if (!bVar1) {
    do {
      bVar1 = utp_socket_impl::send_pkt(this->m_impl,0);
    } while (bVar1);
    if (this->m_impl != (utp_socket_impl *)0x0) {
      utp_socket_impl::maybe_trigger_send_callback(this->m_impl);
      return;
    }
  }
  return;
}

Assistant:

void utp_stream::issue_write()
{
	UTP_LOGV("%8p: new write handler. %d bytes to write\n"
		, static_cast<void*>(m_impl), m_impl->m_write_buffer_size);

	TORRENT_ASSERT(m_impl->m_write_buffer_size > 0);
	TORRENT_ASSERT(m_impl->m_write_handler == false);
	TORRENT_ASSERT(m_impl->m_userdata);

	m_impl->m_write_handler = true;
	m_impl->m_written = 0;
	if (m_impl->test_socket_state()) return;

	// try to write. send_pkt returns false if there's
	// no more payload to send or if the congestion window
	// is full and we can't send more packets right now
	while (m_impl->send_pkt());

	// if there was an error in send_pkt(), m_impl may be
	// 0 at this point
	if (m_impl) m_impl->maybe_trigger_send_callback();
}